

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

xmlAttrPtr xmlC14NFindHiddenParentAttr(xmlC14NCtxPtr ctx,xmlNodePtr cur,xmlChar *name,xmlChar *ns)

{
  xmlAttrPtr pxVar1;
  bool bVar2;
  int local_40;
  xmlAttrPtr res;
  xmlChar *ns_local;
  xmlChar *name_local;
  xmlNodePtr cur_local;
  xmlC14NCtxPtr ctx_local;
  
  name_local = (xmlChar *)cur;
  while( true ) {
    bVar2 = false;
    if (name_local != (xmlChar *)0x0) {
      if (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) {
        local_40 = 1;
      }
      else {
        local_40 = (*ctx->is_visible_callback)
                             (ctx->user_data,(xmlNodePtr)name_local,
                              *(xmlNodePtr *)(name_local + 0x28));
      }
      bVar2 = local_40 == 0;
    }
    if (!bVar2) break;
    pxVar1 = xmlHasNsProp((xmlNode *)name_local,name,ns);
    if (pxVar1 != (xmlAttrPtr)0x0) {
      return pxVar1;
    }
    name_local = *(xmlChar **)(name_local + 0x28);
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

static xmlAttrPtr
xmlC14NFindHiddenParentAttr(xmlC14NCtxPtr ctx, xmlNodePtr cur, const xmlChar * name, const xmlChar * ns)
{
    xmlAttrPtr res;
    while((cur != NULL) && (!xmlC14NIsVisible(ctx, cur, cur->parent))) {
        res = xmlHasNsProp(cur, name, ns);
        if(res != NULL) {
            return res;
        }

        cur = cur->parent;
    }

    return NULL;
}